

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::PipelineStateGLImpl::Destruct(PipelineStateGLImpl *this)

{
  RenderDeviceGLImpl *this_00;
  uint local_14;
  Uint32 i;
  PipelineStateGLImpl *this_local;
  
  this_00 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)this);
  RenderDeviceGLImpl::OnDestroyPSO(this_00,this);
  if (this->m_GLPrograms != (SharedGLProgramPtr *)0x0) {
    for (local_14 = 0; local_14 < this->m_NumPrograms; local_14 = local_14 + 1) {
      std::shared_ptr<Diligent::GLProgram>::~shared_ptr(this->m_GLPrograms + local_14);
    }
    this->m_GLPrograms = (SharedGLProgramPtr *)0x0;
  }
  this->m_ShaderTypes = (SHADER_TYPE *)0x0;
  this->m_NumPrograms = '\0';
  PipelineStateBase<Diligent::EngineGLImplTraits>::Destruct
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  return;
}

Assistant:

void PipelineStateGLImpl::Destruct()
{
    GetDevice()->OnDestroyPSO(*this);

    if (m_GLPrograms)
    {
        for (Uint32 i = 0; i < m_NumPrograms; ++i)
        {
            m_GLPrograms[i].~SharedGLProgramPtr();
        }
        m_GLPrograms = nullptr;
    }

    m_ShaderTypes = nullptr;
    m_NumPrograms = 0;

    TPipelineStateBase::Destruct();
}